

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  uint uVar1;
  char *pcVar2;
  undefined1 __nptr [8];
  bool bVar3;
  int iVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __result;
  DIR *__dirp;
  dirent *pdVar5;
  size_t sVar6;
  int *piVar7;
  long lVar8;
  uint *puVar9;
  long *plVar10;
  ostream *poVar11;
  undefined8 uVar12;
  size_type *psVar13;
  uint *puVar14;
  uint uVar15;
  uint uVar16;
  double *pdVar17;
  double *pdVar18;
  int iVar19;
  int j;
  int iVar20;
  byte bVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  vector<int,_std::allocator<int>_> dirnames;
  char dirname_c [8];
  string dirname;
  string lastdirname;
  char lastdirname_c [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ofstream fout;
  regex re;
  poscar p00;
  poscar pnn;
  poscar delta;
  string local_748;
  int local_728;
  uint local_724;
  uint local_720;
  uint local_71c;
  vector<int,_std::allocator<int>_> local_718;
  char local_6f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  undefined1 *local_6d0;
  long local_6c8;
  undefined1 local_6c0 [16];
  undefined8 local_6b0;
  sub_match<const_char_*> *local_6a8;
  char local_6a0 [8];
  string local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  string local_658;
  undefined1 local_638 [8];
  pointer psStack_630;
  sub_match<const_char_*> local_628 [9];
  ios_base local_540 [264];
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_438;
  poscar local_418;
  poscar local_350;
  undefined1 local_288 [8];
  _Alloc_hider local_280;
  char local_270 [16];
  double local_260 [10];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  vector<int,_std::allocator<int>_> local_1f8;
  int local_1e0;
  vector<double,_std::allocator<double>_> vStack_1d8;
  undefined1 local_1c0 [8];
  _Alloc_hider local_1b8;
  char local_1a8 [16];
  double local_198 [10];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  vector<int,_std::allocator<int>_> vStack_130;
  int local_118;
  vector<double,_std::allocator<double>_> vStack_110;
  poscar local_f8;
  
  bVar21 = 0;
  local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_438,"\\d+",0x10);
  __dirp = opendir("./");
  if (__dirp == (DIR *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"No Directory",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
    std::ostream::put('\x18');
    iVar19 = -1;
    std::ostream::flush();
  }
  else {
LAB_001048c1:
    pdVar5 = readdir(__dirp);
    if (pdVar5 != (dirent *)0x0) {
      if (pdVar5->d_type == '\x04') {
        pcVar2 = pdVar5->d_name;
        sVar6 = strlen(pcVar2);
        local_628[0].super_pair<const_char_*,_const_char_*>.first = (char *)0x0;
        local_628[0].super_pair<const_char_*,_const_char_*>.second = (char *)0x0;
        local_638 = (undefined1  [8])0x0;
        psStack_630 = (pointer)0x0;
        bVar3 = std::__detail::
                __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                          (pcVar2,pdVar5->d_name + sVar6,
                           (match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            *)local_638,&local_438,0);
        if (local_638 != (undefined1  [8])0x0) {
          operator_delete((void *)local_638);
        }
        if (bVar3) {
          local_638 = (undefined1  [8])local_628;
          sVar6 = strlen(pcVar2);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_638,pcVar2,pcVar2 + sVar6)
          ;
          __nptr = local_638;
          piVar7 = __errno_location();
          iVar19 = *piVar7;
          *piVar7 = 0;
          lVar8 = strtol((char *)__nptr,(char **)&local_418,10);
          if ((undefined1  [8])CONCAT71(local_418._1_7_,local_418.ready) != __nptr) {
            iVar20 = (int)lVar8;
            if ((iVar20 == lVar8) && (*piVar7 != 0x22)) {
              if (*piVar7 == 0) {
                *piVar7 = iVar19;
              }
              local_350._0_4_ = iVar20;
              if (local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&local_718,
                           (iterator)
                           local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)&local_350);
              }
              else {
                *local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = iVar20;
                local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              if (local_638 != (undefined1  [8])local_628) {
                operator_delete((void *)local_638);
              }
              goto LAB_001048c1;
            }
            std::__throw_out_of_range("stoi");
          }
          uVar12 = std::__throw_invalid_argument("stoi");
          poscar::~poscar((poscar *)local_288);
          poscar::~poscar((poscar *)local_1c0);
          poscar::~poscar(&local_350);
          poscar::~poscar(&local_418);
          if (local_6d0 != local_6c0) {
            operator_delete(local_6d0);
          }
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    (&local_438);
          if ((uint *)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (uint *)0x0) {
            operator_delete(local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          _Unwind_Resume(uVar12);
        }
      }
      goto LAB_001048c1;
    }
    puVar14 = (uint *)(local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + 1);
    puVar9 = (uint *)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    if (puVar14 !=
        (uint *)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish &&
        local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      uVar15 = *local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        uVar1 = *puVar14;
        uVar16 = uVar15;
        if ((int)uVar15 <= (int)uVar1) {
          uVar16 = uVar1;
        }
        if ((int)uVar15 < (int)uVar1) {
          puVar9 = puVar14;
        }
        puVar14 = puVar14 + 1;
        uVar15 = uVar16;
      } while (puVar14 !=
               (uint *)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    }
    uVar15 = *puVar9;
    sprintf(local_6a0,"%02d",(ulong)uVar15);
    local_6d0 = local_6c0;
    sVar6 = strlen(local_6a0);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_6d0,local_6a0,local_6a0 + sVar6);
    local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"00/POSCAR","");
    poscar::poscar(&local_418,&local_658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_658._M_dataplus._M_p != &local_658.field_2) {
      operator_delete(local_658._M_dataplus._M_p);
    }
    bVar3 = poscar::isReady(&local_418);
    if (bVar3) {
      local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_698,local_6d0,local_6d0 + local_6c8);
      std::__cxx11::string::append((char *)&local_698);
      poscar::poscar(&local_350,&local_698);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_698._M_dataplus._M_p != &local_698.field_2) {
        operator_delete(local_698._M_dataplus._M_p);
      }
      bVar3 = poscar::isReady(&local_350);
      if (bVar3) {
        local_1c0[0] = local_418.ready;
        local_1b8._M_p = local_1a8;
        local_724 = uVar15;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,local_418.title._M_dataplus._M_p,
                   local_418.title._M_dataplus._M_p + local_418.title._M_string_length);
        pdVar17 = &local_418.scale;
        pdVar18 = local_198;
        for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
          *pdVar18 = *pdVar17;
          pdVar17 = pdVar17 + (ulong)bVar21 * -2 + 1;
          pdVar18 = pdVar18 + (ulong)bVar21 * -2 + 1;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_148,&local_418.elements);
        std::vector<int,_std::allocator<int>_>::vector(&vStack_130,&local_418.atomNums);
        local_118 = local_418.atomNum;
        std::vector<double,_std::allocator<double>_>::vector(&vStack_110,&local_418.coods);
        local_288[0] = local_350.ready;
        local_280._M_p = local_270;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_280,local_350.title._M_dataplus._M_p,
                   local_350.title._M_dataplus._M_p + local_350.title._M_string_length);
        pdVar17 = &local_350.scale;
        pdVar18 = local_260;
        for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
          *pdVar18 = *pdVar17;
          pdVar17 = pdVar17 + (ulong)bVar21 * -2 + 1;
          pdVar18 = pdVar18 + (ulong)bVar21 * -2 + 1;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_210,&local_350.elements);
        std::vector<int,_std::allocator<int>_>::vector(&local_1f8,&local_350.atomNums);
        local_1e0 = local_350.atomNum;
        std::vector<double,_std::allocator<double>_>::vector(&vStack_1d8,&local_350.coods);
        uVar15 = local_724;
        poscar::poscar(&local_f8,(poscar *)local_1c0,(poscar *)local_288,local_724);
        poscar::~poscar((poscar *)local_288);
        poscar::~poscar((poscar *)local_1c0);
        if (1 < (int)uVar15) {
          local_6a8 = _VTT;
          local_6b0 = _memcpy;
          local_728 = 0;
          uVar15 = 1;
          do {
            local_720 = uVar15;
            sprintf(local_6f8,"%02d");
            local_6f0._M_dataplus._M_p = (pointer)&local_6f0.field_2;
            sVar6 = strlen(local_6f8);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_6f0,local_6f8,local_6f8 + sVar6);
            mkdir(local_6f8,0x1ed);
            local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_748,local_6f0._M_dataplus._M_p,
                       local_6f0._M_dataplus._M_p + local_6f0._M_string_length);
            std::__cxx11::string::append((char *)&local_748);
            std::ofstream::ofstream(local_638,(string *)&local_748,_S_out);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_748._M_dataplus._M_p != &local_748.field_2) {
              operator_delete(local_748._M_dataplus._M_p);
            }
            local_71c = *(uint *)((((sub_match<const_char_*> *)((long)local_638 + -0x18))->
                                  super_pair<const_char_*,_const_char_*>).first + 0x10 +
                                 (long)&local_628[0].super_pair<const_char_*,_const_char_*>);
            if ((local_71c & 5) == 0) {
              poscar::getTitle_abi_cxx11_(&local_748,&local_f8);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_638,local_748._M_dataplus._M_p,
                                   local_748._M_string_length);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_748._M_dataplus._M_p != &local_748.field_2) {
                operator_delete(local_748._M_dataplus._M_p);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_638,"   ",3);
              pcVar2 = (((sub_match<const_char_*> *)((long)local_638 + -0x18))->
                       super_pair<const_char_*,_const_char_*>).first;
              *(uint *)(pcVar2 + 8 + (long)&local_628[0].super_pair<const_char_*,_const_char_*>) =
                   *(uint *)(pcVar2 + 8 + (long)&local_628[0].super_pair<const_char_*,_const_char_*>
                            ) & 0xfffffefb | 4;
              pcVar2 = (((sub_match<const_char_*> *)((long)local_638 + -0x18))->
                       super_pair<const_char_*,_const_char_*>).first +
                       (long)&local_628[0].super_pair<const_char_*,_const_char_*>;
              pcVar2[0] = '\x12';
              pcVar2[1] = '\0';
              pcVar2[2] = '\0';
              pcVar2[3] = '\0';
              pcVar2[4] = '\0';
              pcVar2[5] = '\0';
              pcVar2[6] = '\0';
              pcVar2[7] = '\0';
              pcVar2 = (char *)((long)&psStack_630 +
                               (long)(((sub_match<const_char_*> *)((long)local_638 + -0x18))->
                                     super_pair<const_char_*,_const_char_*>).first);
              pcVar2[0] = '\x10';
              pcVar2[1] = '\0';
              pcVar2[2] = '\0';
              pcVar2[3] = '\0';
              pcVar2[4] = '\0';
              pcVar2[5] = '\0';
              pcVar2[6] = '\0';
              pcVar2[7] = '\0';
              dVar22 = poscar::getScale(&local_418);
              dVar23 = poscar::getScale(&local_f8);
              dVar24 = (double)(int)local_720;
              poVar11 = std::ostream::_M_insert<double>(dVar23 * dVar24 + dVar22);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_638,"    ",4);
              pcVar2 = (((sub_match<const_char_*> *)((long)local_638 + -0x18))->
                       super_pair<const_char_*,_const_char_*>).first;
              *(uint *)(pcVar2 + 8 + (long)&local_628[0].super_pair<const_char_*,_const_char_*>) =
                   *(uint *)(pcVar2 + 8 + (long)&local_628[0].super_pair<const_char_*,_const_char_*>
                            ) & 0xfffffefb | 4;
              pcVar2 = (((sub_match<const_char_*> *)((long)local_638 + -0x18))->
                       super_pair<const_char_*,_const_char_*>).first +
                       (long)&local_628[0].super_pair<const_char_*,_const_char_*>;
              pcVar2[0] = '\x13';
              pcVar2[1] = '\0';
              pcVar2[2] = '\0';
              pcVar2[3] = '\0';
              pcVar2[4] = '\0';
              pcVar2[5] = '\0';
              pcVar2[6] = '\0';
              pcVar2[7] = '\0';
              pcVar2 = (char *)((long)&psStack_630 +
                               (long)(((sub_match<const_char_*> *)((long)local_638 + -0x18))->
                                     super_pair<const_char_*,_const_char_*>).first);
              pcVar2[0] = '\x10';
              pcVar2[1] = '\0';
              pcVar2[2] = '\0';
              pcVar2[3] = '\0';
              pcVar2[4] = '\0';
              pcVar2[5] = '\0';
              pcVar2[6] = '\0';
              pcVar2[7] = '\0';
              dVar22 = poscar::getLattice(&local_418,0);
              dVar23 = poscar::getLattice(&local_f8,0);
              poVar11 = std::ostream::_M_insert<double>(dVar23 * dVar24 + dVar22);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"   ",3);
              lVar8 = *(long *)poVar11;
              *(uint *)(poVar11 + *(long *)(lVar8 + -0x18) + 0x18) =
                   *(uint *)(poVar11 + *(long *)(lVar8 + -0x18) + 0x18) & 0xfffffefb | 4;
              *(undefined8 *)(poVar11 + *(long *)(lVar8 + -0x18) + 0x10) = 0x13;
              *(undefined8 *)(poVar11 + *(long *)(lVar8 + -0x18) + 8) = 0x10;
              dVar22 = poscar::getLattice(&local_418,1);
              dVar23 = poscar::getLattice(&local_f8,1);
              poVar11 = std::ostream::_M_insert<double>(dVar23 * dVar24 + dVar22);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"   ",3);
              lVar8 = *(long *)poVar11;
              *(uint *)(poVar11 + *(long *)(lVar8 + -0x18) + 0x18) =
                   *(uint *)(poVar11 + *(long *)(lVar8 + -0x18) + 0x18) & 0xfffffefb | 4;
              *(undefined8 *)(poVar11 + *(long *)(lVar8 + -0x18) + 0x10) = 0x13;
              *(undefined8 *)(poVar11 + *(long *)(lVar8 + -0x18) + 8) = 0x10;
              dVar22 = poscar::getLattice(&local_418,2);
              dVar23 = poscar::getLattice(&local_f8,2);
              poVar11 = std::ostream::_M_insert<double>(dVar23 * dVar24 + dVar22);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_638,"    ",4);
              pcVar2 = (((sub_match<const_char_*> *)((long)local_638 + -0x18))->
                       super_pair<const_char_*,_const_char_*>).first;
              *(uint *)(pcVar2 + 8 + (long)&local_628[0].super_pair<const_char_*,_const_char_*>) =
                   *(uint *)(pcVar2 + 8 + (long)&local_628[0].super_pair<const_char_*,_const_char_*>
                            ) & 0xfffffefb | 4;
              pcVar2 = (((sub_match<const_char_*> *)((long)local_638 + -0x18))->
                       super_pair<const_char_*,_const_char_*>).first +
                       (long)&local_628[0].super_pair<const_char_*,_const_char_*>;
              pcVar2[0] = '\x13';
              pcVar2[1] = '\0';
              pcVar2[2] = '\0';
              pcVar2[3] = '\0';
              pcVar2[4] = '\0';
              pcVar2[5] = '\0';
              pcVar2[6] = '\0';
              pcVar2[7] = '\0';
              pcVar2 = (char *)((long)&psStack_630 +
                               (long)(((sub_match<const_char_*> *)((long)local_638 + -0x18))->
                                     super_pair<const_char_*,_const_char_*>).first);
              pcVar2[0] = '\x10';
              pcVar2[1] = '\0';
              pcVar2[2] = '\0';
              pcVar2[3] = '\0';
              pcVar2[4] = '\0';
              pcVar2[5] = '\0';
              pcVar2[6] = '\0';
              pcVar2[7] = '\0';
              dVar22 = poscar::getLattice(&local_418,3);
              dVar23 = poscar::getLattice(&local_f8,3);
              poVar11 = std::ostream::_M_insert<double>(dVar23 * dVar24 + dVar22);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"   ",3);
              lVar8 = *(long *)poVar11;
              *(uint *)(poVar11 + *(long *)(lVar8 + -0x18) + 0x18) =
                   *(uint *)(poVar11 + *(long *)(lVar8 + -0x18) + 0x18) & 0xfffffefb | 4;
              *(undefined8 *)(poVar11 + *(long *)(lVar8 + -0x18) + 0x10) = 0x13;
              *(undefined8 *)(poVar11 + *(long *)(lVar8 + -0x18) + 8) = 0x10;
              dVar22 = poscar::getLattice(&local_418,4);
              dVar23 = poscar::getLattice(&local_f8,4);
              poVar11 = std::ostream::_M_insert<double>(dVar23 * dVar24 + dVar22);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"   ",3);
              lVar8 = *(long *)poVar11;
              *(uint *)(poVar11 + *(long *)(lVar8 + -0x18) + 0x18) =
                   *(uint *)(poVar11 + *(long *)(lVar8 + -0x18) + 0x18) & 0xfffffefb | 4;
              *(undefined8 *)(poVar11 + *(long *)(lVar8 + -0x18) + 0x10) = 0x13;
              *(undefined8 *)(poVar11 + *(long *)(lVar8 + -0x18) + 8) = 0x10;
              dVar22 = poscar::getLattice(&local_418,5);
              dVar23 = poscar::getLattice(&local_f8,5);
              poVar11 = std::ostream::_M_insert<double>(dVar23 * dVar24 + dVar22);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_638,"    ",4);
              pcVar2 = (((sub_match<const_char_*> *)((long)local_638 + -0x18))->
                       super_pair<const_char_*,_const_char_*>).first;
              *(uint *)(pcVar2 + 8 + (long)&local_628[0].super_pair<const_char_*,_const_char_*>) =
                   *(uint *)(pcVar2 + 8 + (long)&local_628[0].super_pair<const_char_*,_const_char_*>
                            ) & 0xfffffefb | 4;
              pcVar2 = (((sub_match<const_char_*> *)((long)local_638 + -0x18))->
                       super_pair<const_char_*,_const_char_*>).first +
                       (long)&local_628[0].super_pair<const_char_*,_const_char_*>;
              pcVar2[0] = '\x13';
              pcVar2[1] = '\0';
              pcVar2[2] = '\0';
              pcVar2[3] = '\0';
              pcVar2[4] = '\0';
              pcVar2[5] = '\0';
              pcVar2[6] = '\0';
              pcVar2[7] = '\0';
              pcVar2 = (char *)((long)&psStack_630 +
                               (long)(((sub_match<const_char_*> *)((long)local_638 + -0x18))->
                                     super_pair<const_char_*,_const_char_*>).first);
              pcVar2[0] = '\x10';
              pcVar2[1] = '\0';
              pcVar2[2] = '\0';
              pcVar2[3] = '\0';
              pcVar2[4] = '\0';
              pcVar2[5] = '\0';
              pcVar2[6] = '\0';
              pcVar2[7] = '\0';
              dVar22 = poscar::getLattice(&local_418,6);
              dVar23 = poscar::getLattice(&local_f8,6);
              poVar11 = std::ostream::_M_insert<double>(dVar23 * dVar24 + dVar22);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"   ",3);
              lVar8 = *(long *)poVar11;
              *(uint *)(poVar11 + *(long *)(lVar8 + -0x18) + 0x18) =
                   *(uint *)(poVar11 + *(long *)(lVar8 + -0x18) + 0x18) & 0xfffffefb | 4;
              *(undefined8 *)(poVar11 + *(long *)(lVar8 + -0x18) + 0x10) = 0x13;
              *(undefined8 *)(poVar11 + *(long *)(lVar8 + -0x18) + 8) = 0x10;
              dVar22 = poscar::getLattice(&local_418,7);
              dVar23 = poscar::getLattice(&local_f8,7);
              poVar11 = std::ostream::_M_insert<double>(dVar23 * dVar24 + dVar22);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"   ",3);
              lVar8 = *(long *)poVar11;
              *(uint *)(poVar11 + *(long *)(lVar8 + -0x18) + 0x18) =
                   *(uint *)(poVar11 + *(long *)(lVar8 + -0x18) + 0x18) & 0xfffffefb | 4;
              *(undefined8 *)(poVar11 + *(long *)(lVar8 + -0x18) + 0x10) = 0x13;
              *(undefined8 *)(poVar11 + *(long *)(lVar8 + -0x18) + 8) = 0x10;
              dVar22 = poscar::getLattice(&local_418,8);
              dVar23 = poscar::getLattice(&local_f8,8);
              poVar11 = std::ostream::_M_insert<double>(dVar23 * dVar24 + dVar22);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_638,"   ",3);
              poscar::getElementsAsString_abi_cxx11_(&local_748,&local_f8);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_638,local_748._M_dataplus._M_p,
                                   local_748._M_string_length);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_748._M_dataplus._M_p != &local_748.field_2) {
                operator_delete(local_748._M_dataplus._M_p);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_638,"   ",3);
              poscar::getAtomNumsAsString_abi_cxx11_(&local_748,&local_f8);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_638,local_748._M_dataplus._M_p,
                                   local_748._M_string_length);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_748._M_dataplus._M_p != &local_748.field_2) {
                operator_delete(local_748._M_dataplus._M_p);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_638,"Direct",6);
              std::ios::widen((char)(((sub_match<const_char_*> *)((long)local_638 + -0x18))->
                                    super_pair<const_char_*,_const_char_*>).first + (char)local_638)
              ;
              std::ostream::put((char)local_638);
              std::ostream::flush();
              iVar19 = 2;
              for (iVar20 = 0; iVar4 = poscar::getAtomNum(&local_f8), iVar20 < iVar4;
                  iVar20 = iVar20 + 1) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_638," ",1);
                pcVar2 = (((sub_match<const_char_*> *)((long)local_638 + -0x18))->
                         super_pair<const_char_*,_const_char_*>).first;
                *(uint *)(pcVar2 + 8 + (long)&local_628[0].super_pair<const_char_*,_const_char_*>) =
                     *(uint *)(pcVar2 + 8 +
                              (long)&local_628[0].super_pair<const_char_*,_const_char_*>) &
                     0xfffffefb | 4;
                pcVar2 = (((sub_match<const_char_*> *)((long)local_638 + -0x18))->
                         super_pair<const_char_*,_const_char_*>).first +
                         (long)&local_628[0].super_pair<const_char_*,_const_char_*>;
                pcVar2[0] = '\x13';
                pcVar2[1] = '\0';
                pcVar2[2] = '\0';
                pcVar2[3] = '\0';
                pcVar2[4] = '\0';
                pcVar2[5] = '\0';
                pcVar2[6] = '\0';
                pcVar2[7] = '\0';
                pcVar2 = (char *)((long)&psStack_630 +
                                 (long)(((sub_match<const_char_*> *)((long)local_638 + -0x18))->
                                       super_pair<const_char_*,_const_char_*>).first);
                pcVar2[0] = '\x10';
                pcVar2[1] = '\0';
                pcVar2[2] = '\0';
                pcVar2[3] = '\0';
                pcVar2[4] = '\0';
                pcVar2[5] = '\0';
                pcVar2[6] = '\0';
                pcVar2[7] = '\0';
                dVar22 = poscar::getCood(&local_418,iVar19 + -2);
                dVar23 = poscar::getCood(&local_f8,iVar19 + -2);
                poVar11 = std::ostream::_M_insert<double>(dVar23 * dVar24 + dVar22);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
                lVar8 = *(long *)poVar11;
                *(uint *)(poVar11 + *(long *)(lVar8 + -0x18) + 0x18) =
                     *(uint *)(poVar11 + *(long *)(lVar8 + -0x18) + 0x18) & 0xfffffefb | 4;
                *(undefined8 *)(poVar11 + *(long *)(lVar8 + -0x18) + 0x10) = 0x13;
                *(undefined8 *)(poVar11 + *(long *)(lVar8 + -0x18) + 8) = 0x10;
                dVar22 = poscar::getCood(&local_418,iVar19 + -1);
                dVar23 = poscar::getCood(&local_f8,iVar19 + -1);
                poVar11 = std::ostream::_M_insert<double>(dVar23 * dVar24 + dVar22);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
                lVar8 = *(long *)poVar11;
                *(uint *)(poVar11 + *(long *)(lVar8 + -0x18) + 0x18) =
                     *(uint *)(poVar11 + *(long *)(lVar8 + -0x18) + 0x18) & 0xfffffefb | 4;
                *(undefined8 *)(poVar11 + *(long *)(lVar8 + -0x18) + 0x10) = 0x13;
                *(undefined8 *)(poVar11 + *(long *)(lVar8 + -0x18) + 8) = 0x10;
                dVar22 = poscar::getCood(&local_418,iVar19);
                dVar23 = poscar::getCood(&local_f8,iVar19);
                poVar11 = std::ostream::_M_insert<double>(dVar23 * dVar24 + dVar22);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
                std::ostream::put((char)poVar11);
                std::ostream::flush();
                iVar19 = iVar19 + 3;
              }
            }
            else {
              std::operator+(&local_678,"Error during making ",&local_6f0);
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_678);
              local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
              psVar13 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_748.field_2._M_allocated_capacity = *psVar13;
                local_748.field_2._8_8_ = plVar10[3];
              }
              else {
                local_748.field_2._M_allocated_capacity = *psVar13;
                local_748._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_748._M_string_length = plVar10[1];
              *plVar10 = (long)psVar13;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,local_748._M_dataplus._M_p,
                                   local_748._M_string_length);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_748._M_dataplus._M_p != &local_748.field_2) {
                operator_delete(local_748._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_678._M_dataplus._M_p != &local_678.field_2) {
                operator_delete(local_678._M_dataplus._M_p);
              }
              local_728 = -1;
            }
            local_638 = (undefined1  [8])local_6a8;
            *(undefined8 *)
             (local_638 + (long)local_6a8[-1].super_pair<const_char_*,_const_char_*>.first) =
                 local_6b0;
            std::filebuf::~filebuf((filebuf *)&psStack_630);
            std::ios_base::~ios_base(local_540);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
              operator_delete(local_6f0._M_dataplus._M_p);
            }
            iVar19 = local_728;
            if ((local_71c & 5) != 0) goto LAB_00105a24;
            uVar15 = local_720 + 1;
          } while (local_720 + 1 != local_724);
        }
        iVar19 = 0;
LAB_00105a24:
        poscar::~poscar(&local_f8);
      }
      else {
        local_638 = (undefined1  [8])local_628;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_638,local_6d0,local_6d0 + local_6c8);
        std::__cxx11::string::append(local_638);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)local_638,(long)psStack_630);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        if (local_638 != (undefined1  [8])local_628) {
          operator_delete((void *)local_638);
        }
        iVar19 = -1;
      }
      poscar::~poscar(&local_350);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"00/POSCAR was not read.",0x17);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
      std::ostream::put('\x18');
      iVar19 = -1;
      std::ostream::flush();
    }
    poscar::~poscar(&local_418);
    if (local_6d0 != local_6c0) {
      operator_delete(local_6d0);
    }
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_438);
  if ((uint *)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return iVar19;
}

Assistant:

int main() {

    // ディレクトリ取得
    vector<int> dirnames;
    regex re("\\d+");
    DIR *dp;        // pointer for directory
    dirent *entry;  // entry point returned by readdir()

    dp = opendir("./");
    if (dp == NULL) {
        cout << "No Directory" << endl;
        return -1;
    }
    do {
        entry = readdir(dp);
        if (entry != NULL) {
            if (entry->d_type == DT_DIR) {
                if (regex_match(entry->d_name, re)) {
                    dirnames.push_back(stoi(entry->d_name));
                }
            }
        }
    } while (entry != NULL);

    int maxdirnum = *max_element(dirnames.begin(), dirnames.end());
    char lastdirname_c[8];
    sprintf(lastdirname_c, "%02d", maxdirnum);
    string lastdirname = string(lastdirname_c);

    // read POSCAR
    poscar p00("00/POSCAR");
    if (!p00.isReady()) {
        cout << "00/POSCAR was not read." << endl;
        return -1;
    }
    poscar pnn(lastdirname + "/POSCAR");
    if (!pnn.isReady()) {
        cout << lastdirname + "/POSCAR was not read." << endl;
        return -1;
    }

    // delta POSCAR
    poscar delta(p00, pnn, maxdirnum);

    // make directory
    for (int i = 1; i < maxdirnum; i++) {
        char dirname_c[8];
        sprintf(dirname_c, "%02d", i);
        string dirname = string(dirname_c);
        const char *dirname_cc = dirname_c;
        mkdir(dirname_cc, 0755);

        // make poscar
        ofstream fout(dirname + "/POSCAR");
        if (!fout) {
            cout << "Error during making " + dirname + "/POSCAR!" << endl;
            return -1;
        }

        fout << delta.getTitle() << endl;
        fout << "   "  << fixed << setw(18) << setprecision(16) << p00.getScale() + delta.getScale() * i << endl;
        fout << "    " << fixed << setw(19) << setprecision(16) << p00.getLattice(0) + delta.getLattice(0) * i
             << "   "  << fixed << setw(19) << setprecision(16) << p00.getLattice(1) + delta.getLattice(1) * i
             << "   "  << fixed << setw(19) << setprecision(16) << p00.getLattice(2) + delta.getLattice(2) * i << endl;
        fout << "    " << fixed << setw(19) << setprecision(16) << p00.getLattice(3) + delta.getLattice(3) * i
             << "   "  << fixed << setw(19) << setprecision(16) << p00.getLattice(4) + delta.getLattice(4) * i
             << "   "  << fixed << setw(19) << setprecision(16) << p00.getLattice(5) + delta.getLattice(5) * i << endl;
        fout << "    " << fixed << setw(19) << setprecision(16) << p00.getLattice(6) + delta.getLattice(6) * i
             << "   "  << fixed << setw(19) << setprecision(16) << p00.getLattice(7) + delta.getLattice(7) * i
             << "   "  << fixed << setw(19) << setprecision(16) << p00.getLattice(8) + delta.getLattice(8) * i << endl;
        fout << "   "  << delta.getElementsAsString() << endl;
        fout << "   "  << delta.getAtomNumsAsString() << endl;
        fout << "Direct" << endl;
        for (int j = 0; j < delta.getAtomNum(); j++) {
            fout << " " << fixed << setw(19) << setprecision(16) << p00.getCood(0 + 3*j) + delta.getCood(0 + 3*j) * i
                 << " " << fixed << setw(19) << setprecision(16) << p00.getCood(1 + 3*j) + delta.getCood(1 + 3*j) * i
                 << " " << fixed << setw(19) << setprecision(16) << p00.getCood(2 + 3*j) + delta.getCood(2 + 3*j) * i << endl;
        }

    }

    return 0;
}